

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::draw_sms
          (Base<(TI::TMS::Personality)3> *this,int start,int end,uint32_t cram_dot)

{
  byte bVar1;
  uint32_t uVar2;
  iterator pvVar3;
  uint32_t *puVar4;
  sbyte sVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  bool bVar23;
  int colour_buffer [256];
  uint local_438 [258];
  
  pvVar3 = this->draw_line_buffer_;
  uVar15 = (ulong)start;
  uVar8 = start;
  if ((0xf < (this->output_pointer_).row) ||
     (uVar20 = start, iVar21 = end,
     (this->super_Storage<(TI::TMS::Personality)3,_void>).horizontal_scroll_lock_ == false)) {
    uVar6 = pvVar3->latched_horizontal_scroll & 7;
    if (start < (int)uVar6) {
      bVar1 = this->background_colour_;
      uVar14 = uVar15;
      do {
        local_438[uVar14] = bVar1 + 0x10;
        uVar14 = uVar14 + 1;
        uVar8 = uVar6;
      } while (uVar6 != uVar14);
    }
    uVar20 = start - uVar6;
    if ((int)(start - uVar6) < 1) {
      uVar20 = 0;
    }
    iVar21 = end - uVar6;
    if (iVar21 < 1) {
      iVar21 = 0;
    }
  }
  if ((int)uVar20 < end) {
    iVar21 = iVar21 - uVar20;
    iVar22 = (int)uVar20 >> 3;
    iVar13 = 8 - (uVar20 & 7);
    if (iVar21 <= iVar13) {
      iVar13 = iVar21;
    }
    uVar6 = *(uint *)((long)&pvVar3->field_5 + (long)iVar22 * 4 + 0x20);
    sVar5 = (sbyte)(uVar20 & 7);
    uVar20 = uVar6 << sVar5;
    if (((pvVar3->field_5).bitmap[iVar22] & 2) != 0) {
      uVar20 = uVar6 >> sVar5;
    }
    uVar17 = (ulong)uVar20;
    uVar14 = (ulong)(uVar20 >> 8);
    uVar16 = (ulong)(uVar20 >> 0x10);
    uVar7 = (ulong)(uVar20 >> 0x18);
    do {
      lVar12 = (long)iVar22;
      bVar1 = (pvVar3->field_5).bitmap[lVar12];
      uVar20 = (uint)bVar1 + (uint)bVar1 & 0x30;
      if ((bVar1 & 2) == 0) {
        if (0 < iVar13) {
          lVar11 = 0;
          do {
            uVar19 = (uint)(uVar17 & 0xff);
            local_438[(int)uVar8 + lVar11] =
                 (int)((uVar16 & 0xff) >> 7) * 4 + (int)((uVar7 & 0xff) >> 7) * 8 +
                 (int)((uVar14 & 0xff) >> 7) * 2 | (uint)((uVar17 & 0xff) >> 7) | uVar20;
            uVar6 = (int)(uVar16 & 0xff) << 0x10;
            uVar18 = (int)(uVar14 & 0xff) << 8;
            uVar17 = (ulong)(uVar19 * 2);
            uVar14 = (ulong)((uVar18 | uVar19) >> 7);
            uVar16 = (ulong)((uVar6 | uVar18) >> 0xf);
            uVar7 = (ulong)(((int)(uVar7 & 0xff) << 0x18 | uVar6) >> 0x17);
            lVar11 = lVar11 + 1;
            iVar9 = (int)lVar11;
          } while (iVar13 != iVar9);
LAB_0018e144:
          uVar8 = uVar8 + iVar9;
        }
      }
      else if (0 < iVar13) {
        lVar11 = 0;
        do {
          uVar19 = ((uint)uVar16 & 0xff) << 0x10;
          uVar6 = ((uint)uVar14 & 0xff) << 8;
          local_438[(int)uVar8 + lVar11] =
               ((uint)uVar16 & 1) * 4 + ((uint)uVar7 & 1) * 8 + ((uint)uVar14 & 1) * 2 |
               (uint)uVar17 & 1 | uVar20;
          uVar17 = (ulong)((uVar6 | (uint)uVar17 & 0xff) >> 1);
          uVar14 = (ulong)((uVar19 | uVar6) >> 9);
          uVar16 = (ulong)(((uint)uVar7 << 0x18 | uVar19) >> 0x11);
          uVar7 = uVar7 >> 1 & 0x7f;
          lVar11 = lVar11 + 1;
          iVar9 = (int)lVar11;
        } while (iVar13 != iVar9);
        goto LAB_0018e144;
      }
      iVar10 = iVar21 - iVar13;
      iVar9 = iVar13;
      if (iVar10 != 0) {
        iVar9 = 8;
        if (iVar10 < 8) {
          iVar9 = iVar10;
        }
        iVar22 = iVar22 + 1;
        uVar20 = *(uint *)((long)&pvVar3->field_5 + lVar12 * 4 + 0x24);
        uVar17 = (ulong)uVar20;
        uVar14 = (ulong)(uVar20 >> 8);
        uVar16 = (ulong)(uVar20 >> 0x10);
        uVar7 = (ulong)(uVar20 >> 0x18);
      }
      bVar23 = iVar21 != iVar13;
      iVar21 = iVar10;
      iVar13 = iVar9;
    } while (bVar23);
  }
  draw_sprites<(TI::TMS::SpriteMode)2,false>(this,'\0',start,end,&default_palette,(int *)local_438);
  puVar4 = this->pixel_target_;
  puVar4[uVar15] =
       cram_dot |
       (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_[local_438[uVar15] & 0x1f];
  iVar21 = start + 1;
  if (iVar21 < end) {
    lVar12 = 0;
    do {
      puVar4[iVar21 + lVar12] =
           (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
           [local_438[iVar21 + lVar12] & 0x1f];
      lVar12 = lVar12 + 1;
    } while (~start + end != (int)lVar12);
  }
  if ((end == 0x100) &&
     ((this->super_Storage<(TI::TMS::Personality)3,_void>).hide_left_column_ == true)) {
    uVar2 = (this->super_Storage<(TI::TMS::Personality)3,_void>).colour_ram_
            [(ulong)this->background_colour_ + 0x10];
    puVar4 = this->pixel_origin_;
    puVar4[7] = uVar2;
    puVar4[6] = uVar2;
    puVar4[5] = uVar2;
    puVar4[4] = uVar2;
    puVar4[3] = uVar2;
    puVar4[2] = uVar2;
    puVar4[1] = uVar2;
    *puVar4 = uVar2;
  }
  return;
}

Assistant:

void Base<personality>::draw_sms([[maybe_unused]] int start, [[maybe_unused]] int end, [[maybe_unused]] uint32_t cram_dot) {
	if constexpr (is_sega_vdp(personality)) {
		int colour_buffer[256];
		auto &line_buffer = *draw_line_buffer_;

		/*
			Add extra border for any pixels that fall before the fine scroll.
		*/
		int tile_start = start, tile_end = end;
		int tile_offset = start;
		if(output_pointer_.row >= 16 || !Storage<personality>::horizontal_scroll_lock_) {
			for(int c = start; c < (line_buffer.latched_horizontal_scroll & 7); ++c) {
				colour_buffer[c] = 16 + background_colour_;
				++tile_offset;
			}

			// Remove the border area from that to which tiles will be drawn.
			tile_start = std::max(start - (line_buffer.latched_horizontal_scroll & 7), 0);
			tile_end = std::max(end - (line_buffer.latched_horizontal_scroll & 7), 0);
		}


		uint32_t pattern;
		uint8_t *const pattern_index = reinterpret_cast<uint8_t *>(&pattern);

		/*
			Add background tiles; these will fill the colour_buffer with values in which
			the low five bits are a palette index, and bit six is set if this tile has
			priority over sprites.
		*/
		if(tile_start < end) {
			const int shift = tile_start & 7;
			int byte_column = tile_start >> 3;
			int pixels_left = tile_end - tile_start;
			int length = std::min(pixels_left, 8 - shift);

			pattern = *reinterpret_cast<const uint32_t *>(line_buffer.tiles.patterns[byte_column]);
			if(line_buffer.tiles.flags[byte_column]&2)
				pattern >>= shift;
			else
				pattern <<= shift;

			while(true) {
				const int palette_offset = (line_buffer.tiles.flags[byte_column]&0x18) << 1;
				if(line_buffer.tiles.flags[byte_column]&2) {
					for(int c = 0; c < length; ++c) {
						colour_buffer[tile_offset] =
							((pattern_index[3] & 0x01) << 3) |
							((pattern_index[2] & 0x01) << 2) |
							((pattern_index[1] & 0x01) << 1) |
							((pattern_index[0] & 0x01) << 0) |
							palette_offset;
						++tile_offset;
						pattern >>= 1;
					}
				} else {
					for(int c = 0; c < length; ++c) {
						colour_buffer[tile_offset] =
							((pattern_index[3] & 0x80) >> 4) |
							((pattern_index[2] & 0x80) >> 5) |
							((pattern_index[1] & 0x80) >> 6) |
							((pattern_index[0] & 0x80) >> 7) |
							palette_offset;
						++tile_offset;
						pattern <<= 1;
					}
				}

				pixels_left -= length;
				if(!pixels_left) break;

				length = std::min(8, pixels_left);
				byte_column++;
				pattern = *reinterpret_cast<const uint32_t *>(line_buffer.tiles.patterns[byte_column]);
			}
		}

		/*
			Apply sprites (if any).
		*/
		draw_sprites<SpriteMode::MasterSystem, false>(0, start, end, palette(), colour_buffer);	// TODO provide good y, as per elsewhere.

		// Map from the 32-colour buffer to real output pixels, applying the specific CRAM dot if any.
		pixel_target_[start] = Storage<personality>::colour_ram_[colour_buffer[start] & 0x1f] | cram_dot;
		for(int c = start+1; c < end; ++c) {
			pixel_target_[c] = Storage<personality>::colour_ram_[colour_buffer[c] & 0x1f];
		}

		// If the VDP is set to hide the left column and this is the final call that'll come
		// this line, hide it.
		if(end == 256) {
			if(Storage<personality>::hide_left_column_) {
				pixel_origin_[0] = pixel_origin_[1] = pixel_origin_[2] = pixel_origin_[3] =
				pixel_origin_[4] = pixel_origin_[5] = pixel_origin_[6] = pixel_origin_[7] =
					Storage<personality>::colour_ram_[16 + background_colour_];
			}
		}
	}
}